

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiCutFab.cpp
# Opt level: O0

void __thiscall
amrex::MultiCutFab::MultiCutFab
          (MultiCutFab *this,BoxArray *ba,DistributionMapping *dm,int ncomp,int ngrow,
          FabArray<amrex::EBCellFlagFab> *cellflags)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  MFInfo *in_RSI;
  MultiCutFab *in_RDI;
  undefined4 in_R8D;
  FabArray<amrex::EBCellFlagFab> *in_R9;
  DefaultFabFactory<amrex::CutFab> *in_stack_ffffffffffffff50;
  BoxArray *bxs;
  FabArray<amrex::CutFab> *in_stack_ffffffffffffff90;
  FabFactory<amrex::CutFab> *factory;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 local_28;
  
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_38 = 0;
  bxs = (BoxArray *)&stack0xffffffffffffffa8;
  local_28 = in_R9;
  MFInfo::MFInfo((MFInfo *)0x117c1d0);
  factory = (FabFactory<amrex::CutFab> *)0x0;
  DefaultFabFactory<amrex::CutFab>::DefaultFabFactory(in_stack_ffffffffffffff50);
  FabArray<amrex::CutFab>::FabArray
            (in_stack_ffffffffffffff90,bxs,(DistributionMapping *)CONCAT44(in_R8D,in_ECX),
             (int)((ulong)in_RDX >> 0x20),(int)in_RDX,in_RSI,factory);
  DefaultFabFactory<amrex::CutFab>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::CutFab> *)0x117c221);
  MFInfo::~MFInfo((MFInfo *)0x117c22b);
  in_RDI->m_cellflags = (FabArray<amrex::EBCellFlagFab> *)local_28;
  remove(in_RDI,&in_RSI->alloc);
  return;
}

Assistant:

MultiCutFab::MultiCutFab (const BoxArray& ba, const DistributionMapping& dm,
                          int ncomp, int ngrow, const FabArray<EBCellFlagFab>& cellflags)
    : m_data(ba,dm,ncomp,ngrow,MFInfo(),DefaultFabFactory<CutFab>()),
      m_cellflags(&cellflags)
{
    remove();
}